

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTex2DArrayCase::iterate(UploadTex2DArrayCase *this)

{
  IVec3 *this_00;
  IVec3 *this_01;
  RenderContext *context;
  TestLog *log;
  code *pcVar1;
  anon_unknown_1 *this_02;
  ChannelOrder CVar2;
  TextureFormat this_03;
  ChannelOrder CVar3;
  bool bVar4;
  int iVar5;
  GLenum err;
  deUint32 dVar6;
  undefined4 uVar7;
  ChannelOrder CVar8;
  undefined4 extraout_var;
  ProgramSources *pPVar9;
  undefined4 extraout_var_00;
  TestError *this_04;
  ShaderProgram *this_05;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  char *pcVar11;
  int y;
  long lVar12;
  int levelNdx;
  uint z;
  allocator<char> local_425;
  ChannelOrder local_424;
  UploadTex2DArrayCase *local_420;
  allocator<char> local_413;
  allocator<char> local_412;
  allocator<char> local_411;
  RenderContext *local_410;
  TextureFormat local_408;
  VertexArrayBinding *local_400;
  string local_3f8;
  undefined1 local_3d8 [8];
  float local_3d0;
  undefined8 local_3cc;
  float local_3c4;
  undefined1 local_3c0 [20];
  float local_3ac;
  ScopedLogSection section;
  deUint8 indices [6];
  float positions [8];
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  string local_310;
  Framebuffer fbo;
  TextureLevel readLevel;
  TextureLevel uploadLevel;
  PixelBufferAccess levelAccess;
  deUint32 local_1f0;
  bool local_1c8;
  VertexArrayBinding vertexArrays [2];
  Functions *gl;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_420 = this;
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf,context);
  local_410 = context;
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&depthStencilTex,context);
  levelAccess.super_ConstPixelBufferAccess.m_format = glu::mapGLInternalFormat(local_420->m_format);
  tcu::TextureLevel::TextureLevel(&uploadLevel,(TextureFormat *)&levelAccess,0x29,0xd,7);
  checkDepthStencilFormatSupport((local_420->super_TestCase).m_context,local_420->m_format);
  for (iVar5 = 0; iVar5 != 7; iVar5 = iVar5 + 1) {
    tcu::TextureLevel::getAccess((PixelBufferAccess *)vertexArrays,&uploadLevel);
    tcu::getSubregion(&levelAccess,(PixelBufferAccess *)vertexArrays,0,0,iVar5,0x29,0xd,1);
    if (iVar5 == 3) {
      renderTestPatternReference(&levelAccess);
    }
    else {
      tcu::clearStencil(&levelAccess,iVar5);
    }
  }
  (*gl->bindTexture)(0x8c1a,depthStencilTex.super_ObjectWrapper.m_object);
  (*gl->texStorage3D)(0x8c1a,1,local_420->m_format,0x29,0xd,7);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&levelAccess.super_ConstPixelBufferAccess,&uploadLevel);
  glu::texSubImage3D(local_410,0x8c1a,0,0,0,0,&levelAccess.super_ConstPixelBufferAccess);
  err = (*gl->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x25e);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8236,0x29,0xd);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(gl);
  levelAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
  levelAccess.super_ConstPixelBufferAccess.m_format.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(&readLevel,(TextureFormat *)&levelAccess,0x29,0xd,1);
  local_400 = vertexArrays + 1;
  this_00 = &levelAccess.super_ConstPixelBufferAccess.m_size;
  CVar8 = R;
  do {
    local_424 = CVar8;
    if (6 < (int)CVar8) {
      pcVar11 = "Pass";
LAB_0127f4c5:
      tcu::TestContext::setTestResult
                ((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)((int)CVar8 < 7),pcVar11);
      tcu::TextureLevel::~TextureLevel(&readLevel);
      tcu::TextureLevel::~TextureLevel(&uploadLevel);
      glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
      return STOP;
    }
    log = ((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    de::toString<int>((string *)vertexArrays,(int *)&local_424);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&levelAccess
                   ,"Level",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            vertexArrays);
    de::toString<int>((string *)positions,(int *)&local_424);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                   "Level ",(string *)positions);
    tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&levelAccess,(string *)local_3d8)
    ;
    std::__cxx11::string::~string((string *)local_3d8);
    std::__cxx11::string::~string((string *)positions);
    std::__cxx11::string::~string((string *)&levelAccess);
    std::__cxx11::string::~string((string *)vertexArrays);
    dVar6 = depthStencilTex.super_ObjectWrapper.m_object;
    CVar2 = local_424;
    memset(vertexArrays,0,0xac);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,
               "#version 300 es\nin highp vec4 a_position;\nin highp vec3 a_texCoord;\nout highp vec3 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
               ,(allocator<char> *)&local_310);
    glu::VertexSource::VertexSource((VertexSource *)local_3d8,&local_3f8);
    pPVar9 = glu::ProgramSources::operator<<
                       ((ProgramSources *)vertexArrays,(ShaderSource *)local_3d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)indices,
               "#version 300 es\nuniform highp usampler2DArray u_sampler;\nin highp vec3 v_texCoord;\nlayout(location = 0) out highp uint o_stencil;\nvoid main (void)\n{\n\to_stencil = texture(u_sampler, v_texCoord).x;\n}\n"
               ,&local_425);
    glu::FragmentSource::FragmentSource((FragmentSource *)positions,(string *)indices);
    pPVar9 = glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)positions);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)&levelAccess,local_410,pPVar9);
    std::__cxx11::string::~string((string *)(positions + 2));
    std::__cxx11::string::~string((string *)indices);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f8);
    glu::ProgramSources::~ProgramSources((ProgramSources *)vertexArrays);
    positions[4] = -1.0;
    positions[5] = 1.0;
    positions[6] = 1.0;
    positions[7] = 1.0;
    local_3d8._0_4_ = R;
    local_3d8._4_4_ = SNORM_INT8;
    local_3d0 = (float)(int)CVar2;
    positions[0] = -1.0;
    positions[1] = -1.0;
    positions[2] = 1.0;
    positions[3] = -1.0;
    local_3cc = 0x3f800000;
    local_3c0._0_8_ = 0x3f80000000000000;
    local_3c0._12_8_ = 0x3f8000003f800000;
    local_3c4 = local_3d0;
    local_3c0._8_4_ = local_3d0;
    local_3ac = local_3d0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"a_position",(allocator<char> *)&local_310);
    glu::va::Float(vertexArrays,&local_3f8,2,4,0,positions);
    std::__cxx11::string::string<std::allocator<char>>((string *)indices,"a_texCoord",&local_425);
    glu::va::Float(vertexArrays + 1,(string *)indices,3,4,0,(float *)local_3d8);
    std::__cxx11::string::~string((string *)indices);
    std::__cxx11::string::~string((string *)&local_3f8);
    indices[4] = '\x01';
    indices[5] = '\x03';
    indices[0] = '\0';
    indices[1] = '\x01';
    indices[2] = '\x02';
    indices[3] = '\x02';
    iVar5 = (*local_410->_vptr_RenderContext[3])();
    lVar12 = CONCAT44(extraout_var_00,iVar5);
    if (local_1c8 == false) {
      this_04 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"Compile failed",(allocator<char> *)&local_310);
      tcu::TestError::TestError(this_04,&local_3f8);
      __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar12 + 8))(0x84c0);
    (**(code **)(lVar12 + 0xb8))(0x8c1a,dVar6);
    (**(code **)(lVar12 + 0x1360))(0x8c1a,0x2801,0x2600);
    (**(code **)(lVar12 + 0x1360))(0x8c1a,0x2800,0x2600);
    (**(code **)(lVar12 + 0x1360))(0x8c1a,0x90ea,0x1901);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"Texture state setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x13e);
    (**(code **)(lVar12 + 0x1680))(local_1f0);
    pcVar1 = *(code **)(lVar12 + 0x14f0);
    uVar7 = (**(code **)(lVar12 + 0xb48))(local_1f0,"u_sampler");
    (*pcVar1)(uVar7,0);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"Program setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x142);
    (**(code **)(lVar12 + 0x1a00))(0,0,0x29,0xd);
    local_3f8._M_dataplus._M_p = (pointer)0x600000000;
    local_3f8._M_string_length._0_4_ = 0;
    local_3f8.field_2._M_allocated_capacity = (size_type)indices;
    glu::draw(local_410,local_1f0,2,vertexArrays,(PrimitiveList *)&local_3f8,(DrawUtilCallback *)0x0
             );
    lVar12 = 0x58;
    do {
      std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar12));
      lVar12 = lVar12 + -0x50;
    } while (lVar12 != -0x48);
    this_05 = (ShaderProgram *)&levelAccess;
    glu::ShaderProgram::~ShaderProgram(this_05);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)this_05,&readLevel);
    glu::readPixels(local_410,0,0,(PixelBufferAccess *)this_05);
    if (local_424 == L) {
      vertexArrays[0].binding.type = 0x13;
      vertexArrays[0].binding._4_4_ = 0x1e;
      pCVar10 = (ConstPixelBufferAccess *)0xd;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&levelAccess,(TextureFormat *)vertexArrays,0x29,0xd,1);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)vertexArrays,(TextureLevel *)&levelAccess);
      renderTestPatternReference((PixelBufferAccess *)vertexArrays);
      this_02 = (anon_unknown_1 *)
                ((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)vertexArrays,(TextureLevel *)&levelAccess);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_3d8,&readLevel);
      bVar4 = compareStencilToRed(this_02,(TestLog *)vertexArrays,
                                  (ConstPixelBufferAccess *)local_3d8,pCVar10);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&levelAccess);
    }
    else {
      local_408 = (TextureFormat)
                  ((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_3d8,&readLevel);
      CVar2 = local_424;
      iVar5 = 0;
      for (z = 0; (int)z < (int)local_3cc; z = z + 1) {
        for (y = 0; y < (int)local_3d0; y = y + 1) {
          this_05 = (ShaderProgram *)(ulong)z;
          tcu::ConstPixelBufferAccess::getPixelInt
                    (&levelAccess.super_ConstPixelBufferAccess,(int)local_3d8,y,z);
          CVar3 = levelAccess.super_ConstPixelBufferAccess.m_format.order;
          if (levelAccess.super_ConstPixelBufferAccess.m_format.order != CVar2) {
            if (iVar5 < 10) {
              levelAccess.super_ConstPixelBufferAccess.m_format = local_408;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
              std::operator<<((ostream *)this_00,"ERROR: Expected ");
              std::ostream::operator<<(this_00,CVar2);
              std::operator<<((ostream *)this_00,", got ");
              std::ostream::operator<<(this_00,CVar3);
              std::operator<<((ostream *)this_00," at (");
              std::ostream::operator<<(this_00,y);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::operator<<(this_00,z);
              std::operator<<((ostream *)this_00,")");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&levelAccess,(EndMessageToken *)&tcu::TestLog::EndMessage
                        );
LAB_0127f2e7:
              std::__cxx11::ostringstream::~ostringstream
                        ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
            }
            else if (iVar5 == 10) {
              levelAccess.super_ConstPixelBufferAccess.m_format = local_408;
              std::__cxx11::ostringstream::ostringstream
                        ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
              std::operator<<((ostream *)&levelAccess.super_ConstPixelBufferAccess.m_size,"...");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&levelAccess,(EndMessageToken *)&tcu::TestLog::EndMessage
                        );
              goto LAB_0127f2e7;
            }
            iVar5 = iVar5 + 1;
          }
        }
      }
      levelAccess.super_ConstPixelBufferAccess.m_format = local_408;
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
      this_01 = &levelAccess.super_ConstPixelBufferAccess.m_size;
      std::operator<<((ostream *)this_01,"Found ");
      std::ostream::operator<<(this_01,iVar5);
      std::operator<<((ostream *)this_01," faulty pixels, comparison ");
      bVar4 = iVar5 == 0;
      pcVar11 = "FAILED!";
      if (bVar4) {
        pcVar11 = "passed.";
      }
      std::operator<<((ostream *)this_01,pcVar11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&levelAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)positions,"ComparisonResult",&local_425);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"Image comparison result",&local_411);
      tcu::LogImageSet::LogImageSet((LogImageSet *)vertexArrays,(string *)positions,&local_3f8);
      tcu::LogImageSet::write((LogImageSet *)vertexArrays,local_408.order,__buf,(size_t)this_05);
      std::__cxx11::string::string<std::allocator<char>>((string *)indices,"Result",&local_412);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"Result stencil buffer",&local_413);
      pCVar10 = (ConstPixelBufferAccess *)local_3d8;
      tcu::LogImage::LogImage
                ((LogImage *)&levelAccess,(string *)indices,&local_310,pCVar10,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      this_03 = local_408;
      tcu::LogImage::write((LogImage *)&levelAccess,local_408.order,__buf_00,(size_t)pCVar10);
      tcu::LogImage::~LogImage((LogImage *)&levelAccess);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)indices);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)vertexArrays);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)positions);
      tcu::TestLog::endImageSet((TestLog *)this_03);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    if (bVar4 == false) {
      pcVar11 = "Image comparison failed";
      goto LAB_0127f4c5;
    }
    CVar8 = local_424 + A;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 41;
		const int					height				= 13;
		const int					levels				= 7;
		const int					ptrnLevel			= 3;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height, levels);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int levelNdx = 0; levelNdx < levels; levelNdx++)
		{
			const tcu::PixelBufferAccess levelAccess = tcu::getSubregion(uploadLevel.getAccess(), 0, 0, levelNdx, width, height, 1);

			if (levelNdx == ptrnLevel)
				renderTestPatternReference(levelAccess);
			else
				tcu::clearStencil(levelAccess, levelNdx);
		}

		gl.bindTexture(GL_TEXTURE_2D_ARRAY, *depthStencilTex);
		gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, m_format, width, height, levels);
		glu::texSubImage3D(renderCtx, GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		{
			TextureLevel	readLevel		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
			bool			allLevelsOk		= true;

			for (int levelNdx = 0; levelNdx < levels; levelNdx++)
			{
				tcu::ScopedLogSection section(m_testCtx.getLog(), "Level" + de::toString(levelNdx), "Level " + de::toString(levelNdx));
				bool levelOk;

				blitStencilToColor2DArray(renderCtx, *depthStencilTex, width, height, levelNdx);
				glu::readPixels(renderCtx, 0, 0, readLevel);

				if (levelNdx == ptrnLevel)
				{
					TextureLevel reference(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);
					renderTestPatternReference(reference);

					levelOk = compareStencilToRed(m_testCtx.getLog(), reference, readLevel);
				}
				else
					levelOk = compareRedChannel(m_testCtx.getLog(), readLevel, levelNdx);

				if (!levelOk)
				{
					allLevelsOk = false;
					break;
				}
			}

			m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allLevelsOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}